

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O2

int h264_prep_sgmap(h264_slice *slice)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  h264_picparm *phVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint32_t uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint32_t uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  
  if (slice->sgmap == (int *)0x0) {
    phVar4 = slice->picparm;
    uVar1 = slice->seqparm->pic_width_in_mbs_minus1;
    uVar2 = slice->seqparm->pic_height_in_map_units_minus1;
    iVar10 = uVar1 + 1;
    iVar5 = uVar2 + 1;
    uVar3 = phVar4->num_slice_groups_minus1;
    iVar9 = uVar3 + 1;
    uVar12 = iVar5 * iVar10;
    piVar8 = (int *)calloc(4,(long)(int)uVar12);
    slice->sgmap = piVar8;
    uVar6 = (phVar4->slice_group_change_rate_minus1 + 1) * slice->slice_group_change_cycle;
    if ((int)uVar12 <= (int)uVar6) {
      uVar6 = uVar12;
    }
    uVar18 = uVar12 - uVar6;
    if (phVar4->slice_group_change_direction_flag == 0) {
      uVar18 = uVar6;
    }
    uVar14 = 0;
    uVar23 = 0;
    if (0 < (int)uVar12) {
      uVar23 = (ulong)uVar12;
    }
    uVar17 = 0;
    uVar21 = 0;
    for (; uVar14 != uVar23; uVar14 = uVar14 + 1) {
      uVar15 = (ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff;
      iVar20 = (int)((long)uVar15 % (long)iVar10);
      iVar19 = (int)((long)uVar15 / (long)iVar10);
      switch(phVar4->slice_group_map_type) {
      case 0:
        iVar20 = (int)uVar21;
        piVar8[uVar14] = iVar20;
        if (uVar17 == phVar4->run_length_minus1[iVar20]) {
          uVar17 = 0;
          uVar21 = (long)(iVar20 + 1) % (long)iVar9 & 0xffffffff;
        }
        else {
          uVar17 = uVar17 + 1;
        }
        break;
      case 1:
        piVar8[uVar14] = ((iVar19 * iVar9) / 2 + iVar20) % iVar9;
        break;
      case 2:
        uVar21 = (ulong)uVar3;
        do {
          piVar8[uVar14] = (int)uVar21;
          do {
            uVar21 = uVar21 - 1;
            if ((int)(uint)uVar21 < 0) goto LAB_001044e7;
            uVar16 = (uint)uVar21 & 0x7fffffff;
            uVar7 = slice->pic_width_in_mbs;
          } while ((((iVar20 < (int)(phVar4->top_left[uVar16] % uVar7)) ||
                    ((int)(phVar4->bottom_right[uVar16] / uVar7) < iVar19)) ||
                   (iVar19 < (int)(phVar4->top_left[uVar16] / uVar7))) ||
                  ((int)(phVar4->bottom_right[uVar16] % uVar7) < iVar20));
        } while( true );
      case 3:
        piVar8[uVar14] = 1;
        break;
      case 4:
        uVar7 = (uint)((long)(int)uVar18 <= (long)uVar14) ^
                phVar4->slice_group_change_direction_flag;
        goto LAB_001044e0;
      case 5:
        uVar17 = iVar20 * iVar5 + iVar19;
        piVar8[uVar14] =
             (uint)((int)uVar18 <= (int)uVar17) ^ phVar4->slice_group_change_direction_flag;
        break;
      case 6:
        if (uVar12 != phVar4->pic_size_in_map_units_minus1 + 1) {
          fwrite("pic_size_in_map_units_minus1 mismatch!\n",0x27,1,_stderr);
          return 1;
        }
        uVar7 = phVar4->slice_group_id[uVar14];
LAB_001044e0:
        piVar8[uVar14] = uVar7;
        break;
      default:
        abort();
      }
LAB_001044e7:
    }
    if (phVar4->slice_group_map_type == 3) {
      uVar12 = phVar4->slice_group_change_direction_flag;
      uVar14 = (long)(int)(iVar10 - uVar12) / 2;
      uVar21 = uVar14 & 0xffffffff;
      uVar23 = (long)(int)(iVar5 - uVar12) / 2;
      uVar11 = uVar23 & 0xffffffff;
      uVar22 = (ulong)(uVar12 - 1);
      uVar3 = uVar12 * 2 - 1;
      uVar18 = uVar12 * -2 + 1;
      uVar14 = uVar14 & 0xffffffff;
      uVar24 = uVar23 & 0xffffffff;
      uVar23 = uVar23 & 0xffffffff;
      uVar15 = uVar21;
      for (iVar5 = 0; iVar5 < (int)uVar6; iVar5 = iVar5 + iVar9) {
        uVar17 = (uint32_t)uVar11;
        uVar13 = (uint32_t)uVar15;
        iVar20 = uVar17 * iVar10 + uVar13;
        iVar9 = piVar8[iVar20];
        piVar8[iVar20] = 0;
        iVar20 = (int)uVar22;
        if ((iVar20 == -1) && (uVar13 == (uint32_t)uVar21)) {
          uVar22 = 0;
          uVar21 = (ulong)(uVar13 - 1);
          uVar15 = (ulong)(uVar13 - 1);
          uVar12 = uVar3;
          if (uVar13 == 0) {
            uVar21 = uVar22;
            uVar15 = uVar22;
          }
        }
        else if ((iVar20 == 1) && (uVar13 == (uint32_t)uVar14)) {
          uVar12 = uVar13 + (uVar13 != uVar1);
          uVar14 = (ulong)uVar12;
          uVar15 = (ulong)uVar12;
          uVar22 = 0;
          uVar12 = uVar18;
        }
        else if ((uVar12 == 0xffffffff) && (uVar17 == (uint32_t)uVar24)) {
          uVar12 = uVar17 - 1;
          if (uVar17 == 0) {
            uVar12 = 0;
          }
          uVar11 = (ulong)uVar12;
          uVar22 = (ulong)uVar18;
          uVar24 = uVar11;
          uVar12 = 0;
        }
        else if ((uVar12 == 1) && (uVar17 == (uint32_t)uVar23)) {
          uVar12 = uVar17 + (uVar17 != uVar2);
          uVar11 = (ulong)uVar12;
          uVar23 = (ulong)uVar12;
          uVar22 = (ulong)uVar3;
          uVar12 = 0;
        }
        else {
          uVar11 = (ulong)(uVar17 + uVar12);
          uVar15 = (ulong)(uVar13 + iVar20);
        }
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

int h264_prep_sgmap(struct h264_slice *slice) {
	if (slice->sgmap)
		return 0;
	int width = slice->seqparm->pic_width_in_mbs_minus1 + 1;
	int height = slice->seqparm->pic_height_in_map_units_minus1 + 1;
	int i, j, k;
	int num = slice->picparm->num_slice_groups_minus1 + 1;
	slice->sgmap = calloc(sizeof *slice->sgmap, width * height);
	j = 0, k = 0;
	int musg0 = slice->slice_group_change_cycle * (slice->picparm->slice_group_change_rate_minus1 + 1);
	if (musg0 > width * height)
		musg0 = width * height;
	int sulg = musg0;
	if (slice->picparm->slice_group_change_direction_flag)
		sulg = width * height - sulg;
	for (i = 0; i < width * height; i++) {
		int x = i % width;
		int y = i / width;
		switch (slice->picparm->slice_group_map_type) {
			case H264_SLICE_GROUP_MAP_INTERLEAVED:
				slice->sgmap[i] = j;
				if (k == slice->picparm->run_length_minus1[j]) {
					k = 0;
					j++;
					j %= num;
				} else {
					k++;
				}
				break;
			case H264_SLICE_GROUP_MAP_DISPERSED:
				slice->sgmap[i] = (x + ((y * num) / 2)) % num;
				break;
			case H264_SLICE_GROUP_MAP_FOREGROUND:
				slice->sgmap[i] = num-1;
				for (j = num - 2; j >= 0; j--) {
					int xtl = slice->picparm->top_left[j] % slice->pic_width_in_mbs;
					int ytl = slice->picparm->top_left[j] / slice->pic_width_in_mbs;
					int xbr = slice->picparm->bottom_right[j] % slice->pic_width_in_mbs;
					int ybr = slice->picparm->bottom_right[j] / slice->pic_width_in_mbs;
					if (x >= xtl && x <= xbr && y >= ytl && y <= ybr)
						slice->sgmap[i] = j;
				}
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_BOX:
				slice->sgmap[i] = 1;
				/* will be fixed below */
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_VERTICAL:
				slice->sgmap[i] = slice->picparm->slice_group_change_direction_flag ^ (i >= sulg);
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_HORIZONTAL:
				k = x * height + y;
				slice->sgmap[i] = slice->picparm->slice_group_change_direction_flag ^ (k >= sulg);
				break;
			case H264_SLICE_GROUP_MAP_EXPLICIT:
				if (width * height != slice->picparm->pic_size_in_map_units_minus1 + 1) {
					fprintf(stderr, "pic_size_in_map_units_minus1 mismatch!\n");
					return 1;
				}
				slice->sgmap[i] = slice->picparm->slice_group_id[i];
				break;
			default:
				abort();
		}
	}
	if (slice->picparm->slice_group_map_type == H264_SLICE_GROUP_MAP_CHANGING_BOX) {
		int cdf = slice->picparm->slice_group_change_direction_flag;
		int x = (width - cdf) / 2;
		int y = (height - cdf) / 2;
		int xmin = x, xmax = x;
		int ymin = y, ymax = y;
		int xdir = cdf - 1;
		int ydir = cdf;
		int muv;
		for (k = 0; k < musg0; k += muv) {
			muv = slice->sgmap[y * width + x];
			slice->sgmap[y * width + x] = 0;
			if (xdir == -1 && x == xmin) {
				if (xmin)
					xmin--;
				x = xmin;
				xdir = 0;
				ydir = 2 * cdf - 1;
			} else if (xdir == 1 && x == xmax) {
				if (xmax != width - 1)
					xmax++;
				x = xmax;
				xdir = 0;
				ydir = 1 - 2 * cdf;
			} else if (ydir == -1 && y == ymin) {
				if (ymin)
					ymin--;
				y = ymin;
				xdir = 1 - 2 * cdf;
				ydir = 0;
			} else if (ydir == 1 && y == ymax) {
				if (ymax != height - 1)
					ymax++;
				y = ymax;
				xdir = 2 * cdf - 1;
				ydir = 0;
			} else {
				x += xdir;
				y += ydir;
			}
		}
	}
	return 0;
}